

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O3

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  N_Vector p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  N_Vector p_Var7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  code *pcVar13;
  code *pcVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  undefined1 auVar27 [16];
  N_Vector Xv [3];
  N_Vector local_c8;
  N_Vector local_c0;
  undefined8 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  piVar1 = (int *)S->content;
  iVar18 = *piVar1;
  uVar20 = piVar1[1];
  uVar2 = *(undefined8 *)(piVar1 + 0x18);
  uVar3 = *(undefined8 *)(piVar1 + 0x16);
  p_Var4 = *(N_Vector *)(piVar1 + 0x1a);
  uVar5 = *(undefined8 *)(piVar1 + 0x1c);
  uVar6 = *(undefined8 *)(piVar1 + 0x1e);
  p_Var7 = *(N_Vector *)(piVar1 + 0x20);
  uVar8 = *(undefined8 *)(piVar1 + 0x22);
  lVar9 = *(long *)(piVar1 + 0x12);
  lVar10 = *(long *)(piVar1 + 0x14);
  uVar11 = *(undefined8 *)(piVar1 + 10);
  uVar12 = *(undefined8 *)(piVar1 + 0x10);
  pcVar13 = *(code **)(piVar1 + 8);
  pcVar14 = *(code **)(piVar1 + 0xe);
  piVar1[3] = 0;
  uVar19 = uVar20 & 0xfffffffe;
  if (uVar19 == 2) {
    if (piVar1[2] == 0) {
      piVar1[6] = -0x270e;
      return -0x270e;
    }
LAB_0013260b:
    N_VScale(0x3ff0000000000000,b,uVar2);
LAB_00132623:
    uVar20 = uVar20 | 2;
    if (uVar20 == 3) {
      iVar16 = (*pcVar14)(delta,uVar12,uVar2,uVar3,1);
      bVar21 = iVar16 < 0;
      if (iVar16 == 0) goto LAB_00132680;
    }
    else {
      N_VScale(0x3ff0000000000000,uVar2,uVar3);
LAB_00132680:
      if (lVar9 == 0) {
        N_VScale(0x3ff0000000000000,uVar3,uVar2);
      }
      else {
        N_VProd(lVar9,uVar3,uVar2);
      }
      dVar22 = (double)N_VDotProd(uVar2,uVar2);
      local_60 = 0.0;
      if (0.0 < dVar22) {
        if (dVar22 < 0.0) {
          local_60 = sqrt(dVar22);
        }
        else {
          local_60 = SQRT(dVar22);
        }
      }
      *(double *)(piVar1 + 4) = local_60;
      if (local_60 <= delta) {
        piVar1[2] = 0;
        iVar18 = 0;
        goto LAB_00132ce8;
      }
      N_VScale(0x3ff0000000000000,uVar2,uVar3);
      N_VScale(0x3ff0000000000000,uVar2,p_Var4);
      if ((lVar10 != 0) && (piVar1[2] == 0)) {
        N_VProd(lVar10,x);
      }
      if (iVar18 < 1) {
LAB_00132d04:
        piVar1[2] = 0;
        *(undefined4 *)((long)S->content + 0x18) = 0x322;
        return 0x322;
      }
      local_50 = (ulong)(uint)-iVar18;
      bVar15 = true;
      iVar16 = 1;
      uVar24 = SUB84(dVar22,0);
      uVar25 = (undefined4)((ulong)dVar22 >> 0x20);
      do {
        piVar1[3] = piVar1[3] + 1;
        if (lVar10 == 0) {
          N_VScale(0x3ff0000000000000,p_Var4,uVar8);
        }
        else {
          N_VDiv(p_Var4,lVar10,uVar8);
        }
        if (uVar19 == 2) {
          N_VScale(0x3ff0000000000000,uVar8,p_Var7);
          iVar17 = (*pcVar14)(delta,uVar12,p_Var7,uVar8,2);
          bVar21 = iVar17 < 0;
          if (iVar17 != 0) goto LAB_00132655;
        }
        iVar17 = (*pcVar13)(uVar11,uVar8,p_Var7);
        bVar21 = iVar17 < 0;
        if (iVar17 != 0) goto LAB_001326b6;
        if (uVar20 == 3) {
          iVar17 = (*pcVar14)(delta,uVar12,p_Var7,uVar8,1);
          bVar21 = iVar17 < 0;
          if (iVar17 != 0) goto LAB_00132655;
        }
        else {
          N_VScale(0x3ff0000000000000,p_Var7,uVar8);
        }
        if (lVar9 == 0) {
          N_VScale(0x3ff0000000000000,uVar8,p_Var7);
        }
        else {
          N_VProd(lVar9,uVar8,p_Var7);
        }
        local_78 = (double)N_VDotProd(p_Var7,uVar2);
        local_78 = (double)CONCAT44(uVar25,uVar24) / local_78;
        uStack_70 = 0;
        local_48._8_4_ = DAT_00138020._8_4_;
        local_48._0_8_ = (ulong)local_78 ^ (ulong)DAT_00138020;
        local_48._12_4_ = DAT_00138020._12_4_;
        N_VLinearSum(0x3ff0000000000000,uVar3,p_Var7,uVar5);
        if (lVar10 == 0) {
          N_VScale(0x3ff0000000000000,uVar5,uVar8);
        }
        else {
          N_VDiv(uVar5,lVar10,uVar8);
        }
        if (uVar19 == 2) {
          N_VScale(0x3ff0000000000000,uVar8,uVar6);
          iVar17 = (*pcVar14)(delta,uVar12,uVar6,uVar8,2);
          bVar21 = iVar17 < 0;
          if (iVar17 != 0) goto LAB_00132655;
        }
        iVar17 = (*pcVar13)(uVar11,uVar8,uVar6);
        bVar21 = iVar17 < 0;
        if (iVar17 != 0) goto LAB_001326b6;
        if (uVar20 == 3) {
          iVar17 = (*pcVar14)(delta,uVar12,uVar6,uVar8,1);
          bVar21 = iVar17 < 0;
          if (iVar17 != 0) goto LAB_00132655;
        }
        else {
          N_VScale(0x3ff0000000000000,uVar6,uVar8);
        }
        if (lVar9 == 0) {
          N_VScale(0x3ff0000000000000,uVar8,uVar6);
        }
        else {
          N_VProd(lVar9,uVar8,uVar6);
        }
        dVar22 = (double)N_VDotProd(uVar6,uVar6);
        auVar27._0_8_ = ~-(ulong)(dVar22 == 0.0) & (ulong)dVar22;
        auVar27._8_8_ = 0;
        local_a8 = auVar27 | ZEXT416((uint)(-(ulong)(dVar22 == 0.0) >> 0x20) & 0x3ff00000) << 0x20;
        dVar22 = (double)N_VDotProd(uVar6,uVar5);
        dVar22 = dVar22 / (double)local_a8._0_8_;
        local_a8._8_4_ = (int)extraout_XMM0_Qb;
        local_a8._0_8_ = dVar22;
        local_a8._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        if ((iVar16 == 1) && (piVar1[2] != 0)) {
          N_VLinearSum(local_78,p_Var4,uVar5,x);
        }
        else {
          local_98._8_8_ = local_78;
          local_98._0_8_ = 0x3ff0000000000000;
          local_c8 = x;
          local_c0 = p_Var4;
          local_b8 = uVar5;
          local_88 = dVar22;
          N_VLinearCombination(3,local_98,&local_c8);
        }
        N_VLinearSum(0x3ff0000000000000,uVar5,uVar6,uVar3);
        dVar23 = (double)N_VDotProd(uVar3,uVar3);
        dVar22 = 0.0;
        if (0.0 < dVar23) {
          dVar22 = (double)N_VDotProd(uVar3,uVar3);
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
        }
        *(double *)(piVar1 + 4) = dVar22;
        if (dVar22 <= delta) goto LAB_00132c6b;
        local_58 = dVar22;
        dVar23 = (double)N_VDotProd(uVar3,uVar2);
        dVar26 = dVar23 / (double)CONCAT44(uVar25,uVar24);
        dVar22 = (double)local_48._0_8_ * dVar26;
        local_98._8_4_ = SUB84(dVar22,0);
        local_98._0_8_ = (local_78 / (double)local_a8._0_8_) * dVar26;
        local_98._12_4_ = (int)((ulong)dVar22 >> 0x20);
        local_88 = 1.0;
        local_c8 = p_Var4;
        local_c0 = p_Var7;
        local_b8 = uVar3;
        N_VLinearCombination(3,local_98,&local_c8);
        bVar15 = iVar16 < iVar18;
        iVar17 = (int)local_50 + iVar16;
        iVar16 = iVar16 + 1;
        uVar24 = SUB84(dVar23,0);
        uVar25 = (undefined4)((ulong)dVar23 >> 0x20);
      } while (iVar17 != 0);
      if (local_60 <= local_58) goto LAB_00132d04;
LAB_00132c6b:
      if (lVar10 != 0) {
        N_VDiv(x,lVar10,x);
      }
      if (uVar19 != 2) {
LAB_00132cc3:
        piVar1[2] = 0;
        if (bVar15) {
          *(undefined4 *)((long)S->content + 0x18) = 0;
          return 0;
        }
        *(undefined4 *)((long)S->content + 0x18) = 0x321;
        return 0x321;
      }
      iVar18 = (*pcVar14)(delta,uVar12,x,uVar8,2);
      bVar21 = iVar18 < 0;
      if (iVar18 == 0) {
        N_VScale(0x3ff0000000000000,uVar8,x);
        goto LAB_00132cc3;
      }
    }
LAB_00132655:
    piVar1[2] = 0;
    iVar16 = -0x328;
    iVar18 = 0x325;
  }
  else {
    if (piVar1[2] != 0) goto LAB_0013260b;
    iVar16 = (*pcVar13)(uVar11,x,uVar2);
    bVar21 = iVar16 < 0;
    if (iVar16 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar2);
      goto LAB_00132623;
    }
LAB_001326b6:
    piVar1[2] = 0;
    iVar16 = -0x325;
    iVar18 = 0x323;
  }
  if (bVar21) {
    iVar18 = iVar16;
  }
LAB_00132ce8:
  *(int *)((long)S->content + 0x18) = iVar18;
  return iVar18;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  sunbooleantype* zeroguess;
  int l, l_max;
  void *A_data, *P_data;
  N_Vector sx, sb;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* local variables for fused vector operations */
  sunrealtype cv[3];
  N_Vector Xv[3];

  /* Make local shorcuts to solver variables. */
  l_max     = SPBCGS_CONTENT(S)->maxl;
  r_star    = SPBCGS_CONTENT(S)->r_star;
  r         = SPBCGS_CONTENT(S)->r;
  p         = SPBCGS_CONTENT(S)->p;
  q         = SPBCGS_CONTENT(S)->q;
  u         = SPBCGS_CONTENT(S)->u;
  Ap        = SPBCGS_CONTENT(S)->Ap;
  vtemp     = SPBCGS_CONTENT(S)->vtemp;
  sb        = SPBCGS_CONTENT(S)->s1;
  sx        = SPBCGS_CONTENT(S)->s2;
  A_data    = SPBCGS_CONTENT(S)->ATData;
  P_data    = SPBCGS_CONTENT(S)->PData;
  atimes    = SPBCGS_CONTENT(S)->ATimes;
  psolve    = SPBCGS_CONTENT(S)->Psolve;
  zeroguess = &(SPBCGS_CONTENT(S)->zeroguess);
  nli       = &(SPBCGS_CONTENT(S)->numiters);
  res_norm  = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft = ((PRETYPE(S) == SUN_PREC_LEFT) || (PRETYPE(S) == SUN_PREC_BOTH));
  preOnRight = ((PRETYPE(S) == SUN_PREC_RIGHT) || (PRETYPE(S) == SUN_PREC_BOTH));
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;
    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft)
  {
    status = psolve(P_data, r_star, r, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, r);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, r, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, r_star);
    SUNCheckLastErr();
  }

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPBCGS", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  /* Begin main iteration loop */

  for (l = 0; l < l_max; l++)
  {
    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x)
    {
      N_VDiv(p, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    status = atimes(A_data, vtemp, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, Ap, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b)
    {
      N_VProd(sb, vtemp, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
    }

    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = N_VDotProd(Ap, r_star);
    SUNCheckLastErr();
    alpha = beta_denom / alpha;

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);
    SUNCheckLastErr();

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x)
    {
      N_VDiv(q, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, q, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    status = atimes(A_data, vtemp, u);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, u, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b)
    {
      N_VProd(sb, vtemp, u);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
    }

    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    SUNCheckLastErr();
    if (omega_denom == ZERO) { omega_denom = ONE; }
    omega = N_VDotProd(u, q);
    SUNCheckLastErr();
    omega /= omega_denom;

    /* Update x = x + alpha*p + omega*q */
    if (l == 0 && *zeroguess)
    {
      N_VLinearSum(alpha, p, omega, q, x);
      SUNCheckLastErr();
    }
    else
    {
      cv[0] = ONE;
      Xv[0] = x;

      cv[1] = alpha;
      Xv[1] = p;

      cv[2] = omega;
      Xv[2] = q;

      SUNCheckCall(N_VLinearCombination(3, cv, Xv, x));
    }

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);
    SUNCheckLastErr();

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    SUNCheckLastErr();

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNLinSolSolve_SPBCGS", "iterate-residual",
                       "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    SUNCheckLastErr();
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha * (beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* udpate beta_denom for next iteration */
    beta_denom = beta_num;
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm))
  {
    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }
    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
    else { LASTFLAG(S) = SUNLS_RES_REDUCED; }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return (LASTFLAG(S));
  }
}